

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall QtMWidgets::Switch::mousePressEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  SwitchPrivate *pSVar2;
  QPoint QVar3;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    QVar3 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar3;
    pSVar2 = (this->d).d;
    pSVar2->leftMouseButtonPressed = true;
    pSVar2->mouseMoveDelta = 0;
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
Switch::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->mouseMoveDelta = 0;

		event->accept();
	}
	else
		event->ignore();
}